

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O1

void BeginDrawing(void)

{
  Matrix *pMVar1;
  float16 result;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  CORE.Time.current = glfwGetTime();
  pMVar1 = RLGL.State.currentMatrix;
  CORE.Time.update = CORE.Time.current - CORE.Time.previous;
  CORE.Time.previous = CORE.Time.current;
  (RLGL.State.currentMatrix)->m0 = 1.0;
  pMVar1->m4 = 0.0;
  pMVar1->m8 = 0.0;
  pMVar1->m12 = 0.0;
  pMVar1->m1 = 0.0;
  pMVar1->m5 = 1.0;
  pMVar1->m9 = 0.0;
  pMVar1->m13 = 0.0;
  pMVar1->m2 = 0.0;
  pMVar1->m6 = 0.0;
  pMVar1->m10 = 1.0;
  pMVar1->m14 = 0.0;
  pMVar1->m3 = 0.0;
  pMVar1->m7 = 0.0;
  pMVar1->m11 = 0.0;
  pMVar1->m15 = 1.0;
  _local_48 = CONCAT44(CORE.Window.screenScale.m1,CORE.Window.screenScale.m0);
  _fStack_40 = CONCAT44(CORE.Window.screenScale.m3,CORE.Window.screenScale.m2);
  _local_38 = CONCAT44(CORE.Window.screenScale.m5,CORE.Window.screenScale.m4);
  _fStack_30 = CONCAT44(CORE.Window.screenScale.m7,CORE.Window.screenScale.m6);
  _local_28 = CONCAT44(CORE.Window.screenScale.m9,CORE.Window.screenScale.m8);
  _fStack_20 = CONCAT44(CORE.Window.screenScale.m11,CORE.Window.screenScale.m10);
  _local_18 = CONCAT44(CORE.Window.screenScale.m13,CORE.Window.screenScale.m12);
  _fStack_10 = CONCAT44(CORE.Window.screenScale.m15,CORE.Window.screenScale.m14);
  rlMultMatrixf(&local_48);
  return;
}

Assistant:

void BeginDrawing(void)
{
    // WARNING: Previously to BeginDrawing() other render textures drawing could happen,
    // consequently the measure for update vs draw is not accurate (only the total frame time is accurate)

    CORE.Time.current = GetTime();      // Number of elapsed seconds since InitTimer()
    CORE.Time.update = CORE.Time.current - CORE.Time.previous;
    CORE.Time.previous = CORE.Time.current;

    rlLoadIdentity();                   // Reset current matrix (modelview)
    rlMultMatrixf(MatrixToFloat(CORE.Window.screenScale)); // Apply screen scaling

    //rlTranslatef(0.375, 0.375, 0);    // HACK to have 2D pixel-perfect drawing on OpenGL 1.1
                                        // NOTE: Not required with OpenGL 3.3+
}